

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-to-double.cc
# Opt level: O3

double double_conversion::RadixStringToIeee<4,char_const*>
                 (char **current,char *end,bool sign,uc16 separator,bool parse_as_hex_float,
                 bool allow_trailing_junk,double junk_string_value,bool read_as_double,
                 bool *result_is_junk)

{
  int iVar1;
  uint uVar2;
  bool bVar3;
  bool bVar4;
  byte bVar5;
  ulong uVar6;
  ulong uVar7;
  byte *pbVar8;
  char *pcVar9;
  char cVar10;
  byte bVar11;
  uint uVar12;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  byte bVar13;
  long lVar14;
  uint uVar15;
  long lVar16;
  int iVar17;
  uint uVar18;
  Double *this;
  long in_FS_OFFSET;
  DiyFp diy_fp;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  *result_is_junk = true;
  local_40 = end;
  do {
    pcVar9 = *current;
    cVar10 = *pcVar9;
    if (cVar10 != '0') {
      lVar14 = 0x18;
      if (read_as_double) {
        lVar14 = 0x35;
      }
      bVar3 = false;
      uVar18 = 0;
      this = (Double *)0x0;
      goto LAB_003dee7e;
    }
    bVar3 = Advance<char_const*>(current,separator,0x10,&local_40);
  } while (!bVar3);
  *result_is_junk = false;
  if (sign) {
LAB_003df1cd:
    junk_string_value = -0.0;
  }
  else {
    junk_string_value = 0.0;
  }
LAB_003df1d5:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return junk_string_value;
  }
  __stack_chk_fail();
LAB_003dee7e:
  uVar12 = (uint)cVar10;
  uVar6 = (ulong)uVar12;
  uVar15 = uVar12 - 0x30;
  if (9 < uVar15) {
    if ((byte)(cVar10 + 0x9fU) < 6) {
      uVar15 = uVar12 - 0x57;
      goto LAB_003deea5;
    }
    if ((byte)(cVar10 + 0xbfU) < 6) {
      uVar15 = uVar12 - 0x37;
      goto LAB_003deea5;
    }
    if (!parse_as_hex_float) {
LAB_003df1f4:
      if (pcVar9 != end && !allow_trailing_junk) {
        do {
          uVar6 = CONCAT71((int7)(uVar6 >> 8),*pcVar9);
          lVar14 = 0;
          while ((&kWhitespaceTable7)[lVar14] != *pcVar9) {
            lVar14 = lVar14 + 1;
            if (lVar14 == 6) goto LAB_003df1d5;
          }
          pcVar9 = pcVar9 + 1;
          *current = pcVar9;
        } while (pcVar9 != end);
      }
      goto LAB_003df0d3;
    }
    if (cVar10 != '.') {
      if ((cVar10 != 'P') && (cVar10 != 'p')) goto LAB_003df1f4;
      *result_is_junk = false;
      goto LAB_003df0ec;
    }
    Advance<char_const*>(current,separator,0x10,&local_40);
    bVar3 = true;
LAB_003deee7:
    pcVar9 = *current;
    cVar10 = *pcVar9;
    goto LAB_003dee7e;
  }
LAB_003deea5:
  uVar12 = uVar18 - 4;
  if (!bVar3) {
    uVar12 = uVar18;
  }
  this = (Double *)((ulong)uVar15 + (long)this * 0x10);
  uVar6 = (long)this >> (sbyte)lVar14;
  if ((int)uVar6 == 0) {
    bVar4 = Advance<char_const*>(current,separator,0x10,&local_40);
    uVar6 = extraout_RDX;
    uVar18 = uVar12;
    if (!bVar4) goto LAB_003deee7;
    goto LAB_003df0d3;
  }
  iVar17 = 1;
  if (1 < (int)uVar6) {
    uVar7 = uVar6 & 0xffffffff;
    do {
      iVar17 = iVar17 + 1;
      uVar7 = uVar7 >> 1;
      uVar18 = (uint)uVar6;
      uVar6 = uVar7;
    } while (3 < uVar18);
  }
  bVar11 = (byte)iVar17;
  uVar7 = (long)this >> (bVar11 & 0x3f);
  bVar4 = Advance<char_const*>(current,separator,0x10,&local_40);
  bVar13 = 1;
  iVar17 = uVar12 + iVar17;
  uVar6 = extraout_RDX_00;
  while (!bVar4) {
    pbVar8 = (byte *)*current;
    if (parse_as_hex_float) {
      bVar5 = *pbVar8;
      if (bVar5 == 0x2e) {
        Advance<char_const*>(current,separator,0x10,&local_40);
        pbVar8 = (byte *)*current;
        bVar3 = true;
        goto LAB_003defba;
      }
    }
    else {
LAB_003defba:
      bVar5 = *pbVar8;
    }
    uVar18 = (int)(char)bVar5 - 0x30;
    uVar6 = (ulong)CONCAT31((int3)(uVar18 >> 8),uVar18 < 10);
    if (('?' < (char)bVar5 || uVar18 >= 10) &&
       ((0x25 < bVar5 - 0x41 ||
        (uVar6 = 0x3f0000003f, (0x3f0000003fU >> ((ulong)(bVar5 - 0x41) & 0x3f) & 1) == 0)))) break;
    bVar13 = bVar13 & bVar5 == 0x30;
    iVar1 = iVar17 + 4;
    if (bVar3) {
      iVar1 = iVar17;
    }
    bVar4 = Advance<char_const*>(current,separator,0x10,&local_40);
    iVar17 = iVar1;
    uVar6 = extraout_RDX_01;
  }
  if (!allow_trailing_junk && !parse_as_hex_float) {
    pcVar9 = *current;
    while (pcVar9 != end) {
      uVar6 = CONCAT71((int7)(uVar6 >> 8),*pcVar9);
      lVar16 = 0;
      while ((&kWhitespaceTable7)[lVar16] != *pcVar9) {
        lVar16 = lVar16 + 1;
        if (lVar16 == 6) goto LAB_003df1d5;
      }
      pcVar9 = pcVar9 + 1;
      *current = pcVar9;
    }
  }
  uVar12 = (uint)this & ~(-1 << (bVar11 & 0x1f));
  uVar18 = 1 << (bVar11 - 1 & 0x1f);
  if ((int)uVar18 < (int)uVar12) {
    uVar7 = uVar7 + 1;
  }
  else if (uVar12 == uVar18) {
    uVar7 = uVar7 + ((byte)(~bVar13 | (byte)uVar7) & 1);
  }
  bVar3 = (uVar7 >> lVar14 & 1) != 0;
  this = (Double *)((long)uVar7 >> bVar3);
  uVar18 = iVar17 + (uint)bVar3;
LAB_003df0d3:
  *result_is_junk = false;
  if (parse_as_hex_float) {
LAB_003df0ec:
    Advance<char_const*>(current,separator,0x10,&local_40);
    bVar3 = false;
    if (**current == '+') {
LAB_003df115:
      Advance<char_const*>(current,separator,0x10,&local_40);
    }
    else if (**current == '-') {
      bVar3 = true;
      goto LAB_003df115;
    }
    uVar12 = 0;
    do {
      uVar15 = (int)**current - 0x30;
      uVar6 = (ulong)uVar15;
      if (9 < uVar15) break;
      uVar15 = -uVar12;
      if (0 < (int)uVar12) {
        uVar15 = uVar12;
      }
      uVar2 = **current + -0x30 + uVar12 * 10;
      if (0x17bb0 < uVar15) {
        uVar2 = uVar12;
      }
      uVar12 = uVar2;
      bVar4 = Advance<char_const*>(current,separator,0x10,&local_40);
      uVar6 = extraout_RDX_02;
    } while (!bVar4);
    uVar15 = -uVar12;
    if (!bVar3) {
      uVar15 = uVar12;
    }
    uVar18 = uVar15 + uVar18;
  }
  if ((uVar18 != 0) && (this != (Double *)0x0)) {
    diy_fp.f_ = (ulong)uVar18;
    diy_fp._8_8_ = uVar6;
    junk_string_value = (double)Double::DiyFpToUint64(this,diy_fp);
    if (sign) {
      junk_string_value = (double)((ulong)junk_string_value ^ (ulong)DAT_004c80e0);
    }
    goto LAB_003df1d5;
  }
  if (!sign) {
LAB_003df1c3:
    junk_string_value = (double)(long)this;
    goto LAB_003df1d5;
  }
  if (this != (Double *)0x0) {
    this = (Double *)-(long)this;
    goto LAB_003df1c3;
  }
  goto LAB_003df1cd;
}

Assistant:

static double RadixStringToIeee(Iterator* current,
                                Iterator end,
                                bool sign,
                                uc16 separator,
                                bool parse_as_hex_float,
                                bool allow_trailing_junk,
                                double junk_string_value,
                                bool read_as_double,
                                bool* result_is_junk) {
  DOUBLE_CONVERSION_ASSERT(*current != end);
  DOUBLE_CONVERSION_ASSERT(!parse_as_hex_float ||
      IsHexFloatString(*current, end, separator, allow_trailing_junk));

  const int kDoubleSize = Double::kSignificandSize;
  const int kSingleSize = Single::kSignificandSize;
  const int kSignificandSize = read_as_double? kDoubleSize: kSingleSize;

  *result_is_junk = true;

  int64_t number = 0;
  int exponent = 0;
  const int radix = (1 << radix_log_2);
  // Whether we have encountered a '.' and are parsing the decimal digits.
  // Only relevant if parse_as_hex_float is true.
  bool post_decimal = false;

  // Skip leading 0s.
  while (**current == '0') {
    if (Advance(current, separator, radix, end)) {
      *result_is_junk = false;
      return SignedZero(sign);
    }
  }

  while (true) {
    int digit;
    if (IsDecimalDigitForRadix(**current, radix)) {
      digit = static_cast<char>(**current) - '0';
      if (post_decimal) exponent -= radix_log_2;
    } else if (IsCharacterDigitForRadix(**current, radix, 'a')) {
      digit = static_cast<char>(**current) - 'a' + 10;
      if (post_decimal) exponent -= radix_log_2;
    } else if (IsCharacterDigitForRadix(**current, radix, 'A')) {
      digit = static_cast<char>(**current) - 'A' + 10;
      if (post_decimal) exponent -= radix_log_2;
    } else if (parse_as_hex_float && **current == '.') {
      post_decimal = true;
      Advance(current, separator, radix, end);
      DOUBLE_CONVERSION_ASSERT(*current != end);
      continue;
    } else if (parse_as_hex_float && (**current == 'p' || **current == 'P')) {
      break;
    } else {
      if (allow_trailing_junk || !AdvanceToNonspace(current, end)) {
        break;
      } else {
        return junk_string_value;
      }
    }

    number = number * radix + digit;
    int overflow = static_cast<int>(number >> kSignificandSize);
    if (overflow != 0) {
      // Overflow occurred. Need to determine which direction to round the
      // result.
      int overflow_bits_count = 1;
      while (overflow > 1) {
        overflow_bits_count++;
        overflow >>= 1;
      }

      int dropped_bits_mask = ((1 << overflow_bits_count) - 1);
      int dropped_bits = static_cast<int>(number) & dropped_bits_mask;
      number >>= overflow_bits_count;
      exponent += overflow_bits_count;

      bool zero_tail = true;
      for (;;) {
        if (Advance(current, separator, radix, end)) break;
        if (parse_as_hex_float && **current == '.') {
          // Just run over the '.'. We are just trying to see whether there is
          // a non-zero digit somewhere.
          Advance(current, separator, radix, end);
          DOUBLE_CONVERSION_ASSERT(*current != end);
          post_decimal = true;
        }
        if (!isDigit(**current, radix)) break;
        zero_tail = zero_tail && **current == '0';
        if (!post_decimal) exponent += radix_log_2;
      }

      if (!parse_as_hex_float &&
          !allow_trailing_junk &&
          AdvanceToNonspace(current, end)) {
        return junk_string_value;
      }

      int middle_value = (1 << (overflow_bits_count - 1));
      if (dropped_bits > middle_value) {
        number++;  // Rounding up.
      } else if (dropped_bits == middle_value) {
        // Rounding to even to consistency with decimals: half-way case rounds
        // up if significant part is odd and down otherwise.
        if ((number & 1) != 0 || !zero_tail) {
          number++;  // Rounding up.
        }
      }

      // Rounding up may cause overflow.
      if ((number & ((int64_t)1 << kSignificandSize)) != 0) {
        exponent++;
        number >>= 1;
      }
      break;
    }
    if (Advance(current, separator, radix, end)) break;
  }

  DOUBLE_CONVERSION_ASSERT(number < ((int64_t)1 << kSignificandSize));
  DOUBLE_CONVERSION_ASSERT(static_cast<int64_t>(static_cast<double>(number)) == number);

  *result_is_junk = false;

  if (parse_as_hex_float) {
    DOUBLE_CONVERSION_ASSERT(**current == 'p' || **current == 'P');
    Advance(current, separator, radix, end);
    DOUBLE_CONVERSION_ASSERT(*current != end);
    bool is_negative = false;
    if (**current == '+') {
      Advance(current, separator, radix, end);
      DOUBLE_CONVERSION_ASSERT(*current != end);
    } else if (**current == '-') {
      is_negative = true;
      Advance(current, separator, radix, end);
      DOUBLE_CONVERSION_ASSERT(*current != end);
    }
    int written_exponent = 0;
    while (IsDecimalDigitForRadix(**current, 10)) {
      // No need to read exponents if they are too big. That could potentially overflow
      // the `written_exponent` variable.
      if (abs(written_exponent) <= 100 * Double::kMaxExponent) {
        written_exponent = 10 * written_exponent + **current - '0';
      }
      if (Advance(current, separator, radix, end)) break;
    }
    if (is_negative) written_exponent = -written_exponent;
    exponent += written_exponent;
  }

  if (exponent == 0 || number == 0) {
    if (sign) {
      if (number == 0) return -0.0;
      number = -number;
    }
    return static_cast<double>(number);
  }

  DOUBLE_CONVERSION_ASSERT(number != 0);
  double result = Double(DiyFp(number, exponent)).value();
  return sign ? -result : result;
}